

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture2DShadow(ShaderEvalContext *c,TexLookupParams *p)

{
  Texture2D *pTVar1;
  float fVar2;
  IVec3 local_14;
  
  pTVar1 = c->textures[0].tex2D;
  local_14.m_data[0] = 0;
  local_14.m_data[1] = 0;
  local_14.m_data[2] = 0;
  fVar2 = tcu::sampleLevelArray2DCompare
                    ((pTVar1->m_view).m_levels,(pTVar1->m_view).m_numLevels,&c->textures[0].sampler,
                     c->in[0].m_data[2],c->in[0].m_data[0],c->in[0].m_data[1],p->lod,&local_14);
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

static void		evalTexture2DShadow				(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadow(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), p.lod); }